

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

bool __thiscall
gtl::internal_btree::
btree<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
::try_merge_or_rebalance
          (btree<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
           *this,iterator *iter)

{
  btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
  bVar1;
  btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
  bVar2;
  btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
  *pbVar3;
  btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
  *pbVar4;
  btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
  *pbVar5;
  ushort uVar6;
  int iVar7;
  char *__function;
  short sVar8;
  int iVar9;
  uint uVar10;
  
  pbVar5 = iter->node;
  if (((ulong)pbVar5 & 7) != 0) {
    __function = 
    "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result, std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>, 256, false>> *, unsigned char, gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result, std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>, 256, false>::slot_type, gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result, std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result, std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>, 256, false>> *, unsigned char, gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result, std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>, 256, false>::slot_type, gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result, std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = const char]"
    ;
    goto LAB_001e2409;
  }
  pbVar3 = *(btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
             **)pbVar5;
  if (pbVar5[8] == (node_type)0x0) {
LAB_001e22b0:
    if (((ulong)pbVar3 & 7) == 0) {
      if ((byte)pbVar5[8] < (byte)pbVar3[10]) {
        pbVar4 = btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
                 ::child(pbVar3,(byte)pbVar5[8] + 1);
        if (((ulong)pbVar4 & 7) == 0) {
          if ((pbVar4[0xb] !=
               (btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
                )0x0) &&
             (pbVar4[0xb] !=
              (btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
               )0xa)) {
            __assert_fail("right->max_count() == kNodeValues",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                          ,0x8ab,
                          "bool gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result, std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>, 256, false>>::try_merge_or_rebalance(iterator *) [Params = gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result, std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>, 256, false>]"
                         );
          }
          pbVar5 = iter->node;
          if (((ulong)pbVar5 & 7) == 0) {
            bVar1 = pbVar5[10];
            bVar2 = pbVar4[10];
            if ((uint)(byte)bVar1 + (uint)(byte)bVar2 + 1 < 0xb) {
              merge_nodes(this,pbVar5,pbVar4);
              return true;
            }
            if ((5 < (byte)bVar2) &&
               ((bVar1 == (btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
                           )0x0 || (0 < iter->position)))) {
              uVar10 = (uint)(byte)bVar2 - (uint)(byte)bVar1;
              iVar7 = (int)(short)((short)((uVar10 & 0xffff) >> 0xf) + (short)uVar10) >> 1;
              iVar9 = (byte)bVar2 - 1;
              if (iVar7 <= iVar9) {
                iVar9 = iVar7;
              }
              btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
              ::rebalance_right_to_left(pbVar5,iVar9,pbVar4,(allocator_type *)this);
              return false;
            }
            goto LAB_001e236b;
          }
        }
      }
      else {
LAB_001e236b:
        if (((ulong)pbVar5 & 7) == 0) {
          if (pbVar5[8] == (node_type)0x0) {
            return false;
          }
          pbVar5 = btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
                   ::child(pbVar3,(byte)pbVar5[8] - 1);
          if (((ulong)pbVar5 & 7) == 0) {
            bVar1 = pbVar5[10];
            if ((byte)bVar1 < 6) {
              return false;
            }
            pbVar3 = iter->node;
            if (((ulong)pbVar3 & 7) == 0) {
              bVar2 = pbVar3[10];
              uVar6 = (ushort)(byte)bVar2;
              if (bVar2 == (btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
                            )0x0) {
                uVar6 = 0;
              }
              else if ((int)(uint)(byte)bVar2 <= iter->position) {
                return false;
              }
              sVar8 = (byte)bVar1 - uVar6;
              iVar7 = (int)(short)(sVar8 - (sVar8 >> 0xf)) >> 1;
              iVar9 = (byte)bVar1 - 1;
              if (iVar7 <= (int)((byte)bVar1 - 1)) {
                iVar9 = iVar7;
              }
              btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
              ::rebalance_left_to_right(pbVar5,iVar9,pbVar3,(allocator_type *)this);
              iter->position = iter->position + iVar9;
              return false;
            }
          }
        }
      }
    }
  }
  else {
    pbVar4 = btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
             ::child(pbVar3,(byte)pbVar5[8] - 1);
    if (((ulong)pbVar4 & 7) == 0) {
      if ((pbVar4[0xb] !=
           (btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
            )0x0) &&
         (pbVar4[0xb] !=
          (btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
           )0xa)) {
        __assert_fail("left->max_count() == kNodeValues",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                      ,0x8a0,
                      "bool gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result, std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>, 256, false>>::try_merge_or_rebalance(iterator *) [Params = gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result, std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>, 256, false>]"
                     );
      }
      pbVar5 = iter->node;
      if (((ulong)pbVar5 & 7) == 0) {
        if ((uint)(byte)pbVar5[10] + (byte)pbVar4[10] + 1 < 0xb) {
          iter->position = iter->position + (byte)pbVar4[10] + 1;
          merge_nodes(this,pbVar4,pbVar5);
          iter->node = pbVar4;
          return true;
        }
        goto LAB_001e22b0;
      }
    }
  }
  __function = 
  "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result, std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>, 256, false>> *, unsigned char, gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result, std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>, 256, false>::slot_type, gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result, std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result, std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>, 256, false>> *, unsigned char, gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result, std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>, 256, false>::slot_type, gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result, std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
  ;
LAB_001e2409:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/internal/layout.h"
                ,0x1e1,__function);
}

Assistant:

bool btree<P>::try_merge_or_rebalance(iterator *iter) {
  node_type *parent = iter->node->parent();
  if (iter->node->position() > 0) {
    // Try merging with our left sibling.
    node_type *left = parent->child(iter->node->position() - 1);
    assert(left->max_count() == kNodeValues);
    if ((1 + left->count() + iter->node->count()) <= kNodeValues) {
      iter->position += 1 + left->count();
      merge_nodes(left, iter->node);
      iter->node = left;
      return true;
    }
  }
  if (iter->node->position() < parent->count()) {
    // Try merging with our right sibling.
    node_type *right = parent->child(iter->node->position() + 1);
    assert(right->max_count() == kNodeValues);
    if ((1 + iter->node->count() + right->count()) <= kNodeValues) {
      merge_nodes(iter->node, right);
      return true;
    }
    // Try rebalancing with our right sibling. We don't perform rebalancing if
    // we deleted the first element from iter->node and the node is not
    // empty. This is a small optimization for the common pattern of deleting
    // from the front of the tree.
    if ((right->count() > kMinNodeValues) &&
        ((iter->node->count() == 0) ||
         (iter->position > 0))) {
      int to_move = (right->count() - iter->node->count()) / 2;
      to_move = std::min(to_move, right->count() - 1);
      iter->node->rebalance_right_to_left(to_move, right, mutable_allocator());
      return false;
    }
  }
  if (iter->node->position() > 0) {
    // Try rebalancing with our left sibling. We don't perform rebalancing if
    // we deleted the last element from iter->node and the node is not
    // empty. This is a small optimization for the common pattern of deleting
    // from the back of the tree.
    node_type *left = parent->child(iter->node->position() - 1);
    if ((left->count() > kMinNodeValues) &&
        ((iter->node->count() == 0) ||
         (iter->position < iter->node->count()))) {
      int to_move = (left->count() - iter->node->count()) / 2;
      to_move = std::min(to_move, left->count() - 1);
      left->rebalance_left_to_right(to_move, iter->node, mutable_allocator());
      iter->position += to_move;
      return false;
    }
  }
  return false;
}